

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

void __thiscall namedlabels::~namedlabels(namedlabels *this)

{
  size_type sVar1;
  reference pvVar2;
  vector<substring,_std::allocator<substring>_> *in_RDI;
  vector<substring,_std::allocator<substring>_> *unaff_retaddr;
  _func_void_substring_unsigned_long *in_stack_00000008;
  
  sVar1 = std::vector<substring,_std::allocator<substring>_>::size(in_RDI);
  if (sVar1 != 0) {
    pvVar2 = std::vector<substring,_std::allocator<substring>_>::operator[](in_RDI,0);
    free(pvVar2->begin);
  }
  v_hashmap<substring,_unsigned_long>::iter
            ((v_hashmap<substring,_unsigned_long> *)this,in_stack_00000008);
  v_hashmap<substring,_unsigned_long>::delete_v((v_hashmap<substring,_unsigned_long> *)0x1991c9);
  v_hashmap<substring,_unsigned_long>::~v_hashmap((v_hashmap<substring,_unsigned_long> *)0x1991d9);
  std::vector<substring,_std::allocator<substring>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

~namedlabels()
  {
    if (id2name.size() > 0)
      free(id2name[0].begin);
    name2id.iter(deleter);
    name2id.delete_v();
  }